

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall CCharmapToUni::load_table(CCharmapToUni *this,osfildef *fp)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  FILE *in_RSI;
  long *in_RDI;
  uchar *p;
  size_t cur;
  uint entry_cnt;
  uchar buf [256];
  undefined1 *local_130;
  ulong local_128;
  uint local_11c;
  undefined1 local_118 [4];
  undefined1 auStack_114 [260];
  FILE *local_10;
  
  local_10 = in_RSI;
  sVar3 = fread(local_118,6,1,in_RSI);
  if (sVar3 == 1) {
    local_11c = ::osrp2(auStack_114);
    while (local_11c != 0) {
      local_128 = 0x40;
      if (local_11c < 0x40) {
        local_128 = (ulong)local_11c;
      }
      sVar3 = fread(local_118,local_128 << 2,1,local_10);
      if (sVar3 != 1) {
        return;
      }
      local_11c = local_11c - (int)local_128;
      local_130 = local_118;
      for (; local_128 != 0; local_128 = local_128 - 1) {
        iVar1 = ::osrp2(local_130);
        iVar2 = ::osrp2(local_130 + 2);
        (**(code **)(*in_RDI + 0x38))(in_RDI,iVar1,iVar2);
        local_130 = local_130 + 4;
      }
    }
  }
  return;
}

Assistant:

void CCharmapToUni::load_table(osfildef *fp)
{
    uchar buf[256];
    uint entry_cnt;

    /* read the header and the local table header */
    if (osfrb(fp, buf, 6))
        return;

    /* get the local table size from the local table header */
    entry_cnt = osrp2(buf + 4);

    /* read the mappings */
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* figure out how many entries we can read this time */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read the entries */
        if (osfrb(fp, buf, cur*4))
            return;

        /* deduct this number from the remaining count */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; p += 4, --cur)
        {
            /* map this entry */
            set_mapping(osrp2(p), osrp2(p+2));
        }
    }
}